

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Polystar::updatePath(Polystar *this,VPath *path,int frameNo)

{
  VPath *in_RSI;
  VMatrix *in_RDI;
  float fVar1;
  VMatrix m;
  float rotation;
  float outerRoundness;
  float innerRoundness;
  float outerRadius;
  float innerRadius;
  float points;
  VPointF pos;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  VPath *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float fVar2;
  undefined4 in_stack_ffffffffffffff80;
  VMatrix local_5c;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  VPointF local_1c;
  VPath *pVVar3;
  VMatrix *this_00;
  
  this_00 = in_RDI;
  local_1c = internal::model::Property<VPointF,_void>::value
                       ((Property<VPointF,_void> *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  local_20 = internal::model::Property<float,_void>::value
                       ((Property<float,_void> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)in_stack_ffffffffffffff6c);
  local_24 = internal::model::Property<float,_void>::value
                       ((Property<float,_void> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)in_stack_ffffffffffffff6c);
  local_28 = internal::model::Property<float,_void>::value
                       ((Property<float,_void> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)in_stack_ffffffffffffff6c);
  local_2c = internal::model::Property<float,_void>::value
                       ((Property<float,_void> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)in_stack_ffffffffffffff6c);
  local_30 = internal::model::Property<float,_void>::value
                       ((Property<float,_void> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)in_stack_ffffffffffffff6c);
  local_34 = internal::model::Property<float,_void>::value
                       ((Property<float,_void> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (int)in_stack_ffffffffffffff6c);
  VPath::reset((VPath *)0x163888);
  VMatrix::VMatrix(&local_5c);
  pVVar3 = in_RSI;
  if (*(int *)(*(long *)(in_RDI + 1) + 0x14) == 1) {
    fVar1 = local_20;
    internal::model::Shape::direction(*(Shape **)(in_RDI + 1));
    VPath::addPolystar((VPath *)CONCAT44(fVar1,in_stack_ffffffffffffff80),
                       (float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),in_stack_ffffffffffffff74,
                       in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                       ,(float)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                       SUB84(in_stack_ffffffffffffff60,0),(Direction)in_stack_ffffffffffffff5c);
    in_RSI = in_stack_ffffffffffffff60;
  }
  else {
    in_stack_ffffffffffffff6c = local_20;
    fVar1 = local_28;
    fVar2 = local_30;
    internal::model::Shape::direction(*(Shape **)(in_RDI + 1));
    VPath::addPolygon((VPath *)CONCAT44(fVar2,fVar1),in_stack_ffffffffffffff6c,
                      in_stack_ffffffffffffff68,(float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,CCW);
  }
  fVar1 = VPointF::x(&local_1c);
  VPointF::y(&local_1c);
  VMatrix::translate((VMatrix *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0));
  VMatrix::rotate(this_00,(float)((ulong)pVVar3 >> 0x20),(Axis)pVVar3);
  VMatrix::rotate(this_00,(float)((ulong)pVVar3 >> 0x20),(Axis)pVVar3);
  VPath::transform(in_RSI,(VMatrix *)CONCAT44(fVar1,in_stack_ffffffffffffff58));
  return;
}

Assistant:

void renderer::Polystar::updatePath(VPath &path, int frameNo)
{
    VPointF pos = mData->mPos.value(frameNo);
    float   points = mData->mPointCount.value(frameNo);
    float   innerRadius = mData->mInnerRadius.value(frameNo);
    float   outerRadius = mData->mOuterRadius.value(frameNo);
    float   innerRoundness = mData->mInnerRoundness.value(frameNo);
    float   outerRoundness = mData->mOuterRoundness.value(frameNo);
    float   rotation = mData->mRotation.value(frameNo);

    path.reset();
    VMatrix m;

    if (mData->mPolyType == model::Polystar::PolyType::Star) {
        path.addPolystar(points, innerRadius, outerRadius, innerRoundness,
                         outerRoundness, 0.0, 0.0, 0.0, mData->direction());
    } else {
        path.addPolygon(points, outerRadius, outerRoundness, 0.0, 0.0, 0.0,
                        mData->direction());
    }

    m.translate(pos.x(), pos.y()).rotate(rotation);
    m.rotate(rotation);
    path.transform(m);
}